

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrsbit.c
# Opt level: O3

FT_Error pfr_load_bitmap_bits
                   (FT_Byte *p,FT_Byte *limit,FT_UInt format,FT_Bool decreasing,FT_Bitmap *target)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  FT_Error in_EAX;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  uchar *puVar13;
  uchar *puVar14;
  FT_Byte FVar15;
  FT_UInt n;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  
  uVar8 = target->rows;
  if (uVar8 == 0) {
    return in_EAX;
  }
  uVar2 = target->width;
  if (uVar2 == 0) {
    return 0;
  }
  iVar3 = target->pitch;
  uVar16 = uVar2 * uVar8;
  lVar19 = 0;
  if (decreasing == '\0') {
    lVar19 = (long)(int)((uVar8 - 1) * iVar3);
    iVar3 = -iVar3;
  }
  puVar13 = target->buffer + lVar19;
  if (format == 2) {
    if (uVar16 == 0) {
      return uVar2;
    }
    bVar9 = true;
    bVar20 = true;
    uVar8 = 0x80;
    uVar6 = 0;
    puVar14 = puVar13;
    uVar11 = uVar2;
    uVar10 = 0;
    do {
      if ((bVar20) && (p < limit)) {
        lVar19 = (long)limit - (long)p;
        pbVar12 = p;
        do {
          uVar10 = (uint)*pbVar12;
          bVar9 = (bool)(bVar9 ^ 1);
          p = pbVar12 + 1;
          if (*pbVar12 != 0) goto LAB_0014a977;
          lVar19 = lVar19 + -1;
          pbVar12 = pbVar12 + 1;
        } while (lVar19 != 0);
        uVar10 = 0;
        p = limit;
      }
LAB_0014a977:
      uVar7 = uVar8;
      if (!bVar9) {
        uVar7 = 0;
      }
      uVar6 = uVar6 | uVar7;
      uVar11 = uVar11 - 1;
      if (uVar11 == 0) {
        *puVar13 = (uchar)uVar6;
        puVar13 = puVar14 + iVar3;
        uVar6 = 0;
        uVar8 = 0x80;
        puVar14 = puVar13;
        uVar11 = uVar2;
      }
      else if (uVar8 < 2) {
        *puVar13 = (uchar)uVar6;
        puVar13 = puVar13 + 1;
        uVar6 = 0;
        uVar8 = 0x80;
      }
      else {
        uVar8 = uVar8 >> 1;
      }
      uVar5 = (uchar)uVar6;
      bVar20 = (int)uVar10 < 2;
      uVar16 = uVar16 - 1;
      uVar10 = uVar10 - 1;
    } while (uVar16 != 0);
  }
  else if (format == 1) {
    if (uVar16 == 0) {
      return uVar2;
    }
    bVar20 = true;
    uVar8 = 0x80;
    uVar7 = 0;
    uVar6 = 0;
    uVar10 = 0;
    bVar9 = true;
    puVar14 = puVar13;
    uVar11 = uVar2;
    do {
      uVar4 = uVar6;
      uVar18 = uVar10;
      uVar17 = uVar8;
      if (bVar20) {
        do {
          uVar18 = uVar10;
          uVar6 = uVar4;
          if (bVar9) {
            if (limit <= p) {
              bVar9 = true;
              goto LAB_0014a8c1;
            }
            bVar1 = *p;
            p = p + 1;
            uVar6 = (uint)(bVar1 >> 4);
            bVar9 = false;
            uVar4 = bVar1 & 0xf;
          }
          else {
            bVar9 = true;
            uVar4 = uVar6;
          }
          bVar20 = uVar6 == 0;
          uVar18 = uVar6;
          uVar10 = 0;
          uVar6 = uVar4;
        } while (bVar20);
      }
      if (!bVar9) {
        uVar17 = 0;
      }
LAB_0014a8c1:
      uVar7 = uVar7 | uVar17;
      uVar11 = uVar11 - 1;
      if (uVar11 == 0) {
        *puVar13 = (uchar)uVar7;
        puVar13 = puVar14 + iVar3;
        uVar7 = 0;
        uVar8 = 0x80;
        puVar14 = puVar13;
        uVar11 = uVar2;
      }
      else if (uVar8 < 2) {
        *puVar13 = (uchar)uVar7;
        puVar13 = puVar13 + 1;
        uVar7 = 0;
        uVar8 = 0x80;
      }
      else {
        uVar8 = uVar8 >> 1;
      }
      uVar5 = (uchar)uVar7;
      uVar10 = uVar18 - 1;
      bVar20 = (int)uVar18 < 2;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  else {
    if (format != 0) {
      return uVar2;
    }
    uVar11 = ((int)limit - (int)p) * 8;
    if (uVar16 <= uVar11) {
      uVar11 = uVar16;
    }
    if (uVar11 == 0) {
      return uVar2;
    }
    uVar8 = 0x80;
    uVar6 = 0;
    FVar15 = '\0';
    puVar14 = puVar13;
    uVar10 = uVar2;
    uVar16 = uVar11;
    do {
      if (((uVar16 ^ uVar11) & 7) == 0) {
        FVar15 = *p;
        p = p + 1;
      }
      uVar6 = uVar6 | (int)(char)FVar15 >> 7 & uVar8;
      uVar10 = uVar10 - 1;
      if (uVar10 == 0) {
        *puVar13 = (uchar)uVar6;
        puVar13 = puVar14 + iVar3;
        uVar6 = 0;
        uVar8 = 0x80;
        puVar14 = puVar13;
        uVar10 = uVar2;
      }
      else if (uVar8 < 2) {
        *puVar13 = (uchar)uVar6;
        puVar13 = puVar13 + 1;
        uVar6 = 0;
        uVar8 = 0x80;
      }
      else {
        uVar8 = uVar8 >> 1;
      }
      uVar5 = (uchar)uVar6;
      FVar15 = FVar15 * '\x02';
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  if (uVar8 != 0x80) {
    *puVar13 = uVar5;
  }
  return uVar2;
}

Assistant:

static FT_Error
  pfr_load_bitmap_bits( FT_Byte*    p,
                        FT_Byte*    limit,
                        FT_UInt     format,
                        FT_Bool     decreasing,
                        FT_Bitmap*  target )
  {
    FT_Error          error = FT_Err_Ok;
    PFR_BitWriterRec  writer;


    if ( target->rows > 0 && target->width > 0 )
    {
      pfr_bitwriter_init( &writer, target, decreasing );

      switch ( format )
      {
      case 0: /* packed bits */
        pfr_bitwriter_decode_bytes( &writer, p, limit );
        break;

      case 1: /* RLE1 */
        pfr_bitwriter_decode_rle1( &writer, p, limit );
        break;

      case 2: /* RLE2 */
        pfr_bitwriter_decode_rle2( &writer, p, limit );
        break;

      default:
        ;
      }
    }

    return error;
  }